

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * psd_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uint32 uVar1;
  int iVar2;
  int iVar3;
  uint32 x_00;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uchar *puVar10;
  uchar *puVar11;
  int iVar12;
  int iVar13;
  uchar *local_48;
  
  uVar1 = get32(s);
  if (uVar1 == 0x38425053) {
    iVar2 = get8(s);
    iVar3 = get8(s);
    if (iVar3 + iVar2 * 0x100 == 1) {
      if ((FILE *)s->img_file == (FILE *)0x0) {
        s->img_buffer = s->img_buffer + 6;
      }
      else {
        fseek((FILE *)s->img_file,6,1);
      }
      iVar2 = get8(s);
      iVar3 = get8(s);
      uVar9 = iVar3 + iVar2 * 0x100;
      if (uVar9 < 0x11) {
        uVar1 = get32(s);
        x_00 = get32(s);
        iVar2 = get8(s);
        iVar3 = get8(s);
        if (iVar3 + iVar2 * 0x100 == 8) {
          iVar2 = get8(s);
          iVar3 = get8(s);
          if (iVar3 + iVar2 * 0x100 == 3) {
            uVar4 = get32(s);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + (int)uVar4;
            }
            else {
              fseek((FILE *)s->img_file,(long)(int)uVar4,1);
            }
            uVar4 = get32(s);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + (int)uVar4;
            }
            else {
              fseek((FILE *)s->img_file,(long)(int)uVar4,1);
            }
            uVar4 = get32(s);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + (int)uVar4;
            }
            else {
              fseek((FILE *)s->img_file,(long)(int)uVar4,1);
            }
            iVar2 = get8(s);
            iVar3 = get8(s);
            iVar3 = iVar3 + iVar2 * 0x100;
            if (iVar3 < 2) {
              iVar2 = uVar1 * x_00;
              local_48 = (uchar *)malloc((long)(iVar2 * 4));
              if (local_48 == (uchar *)0x0) {
                failure_reason = "Out of memory";
              }
              else {
                if (iVar3 == 0) {
                  uVar8 = 0;
                  puVar10 = local_48;
                  do {
                    if (uVar9 < uVar8) {
                      if (0 < iVar2) {
                        lVar7 = 0;
                        do {
                          puVar10[lVar7 * 4] = -(uVar8 == 3);
                          lVar7 = lVar7 + 1;
                        } while (iVar2 != (int)lVar7);
                      }
                    }
                    else if (0 < iVar2) {
                      lVar7 = 0;
                      do {
                        iVar3 = get8(s);
                        puVar10[lVar7 * 4] = (uchar)iVar3;
                        lVar7 = lVar7 + 1;
                      } while (iVar2 != (int)lVar7);
                    }
                    uVar8 = uVar8 + 1;
                    puVar10 = puVar10 + 1;
                  } while (uVar8 != 4);
                }
                else {
                  iVar3 = uVar9 * uVar1 * 2;
                  if ((FILE *)s->img_file == (FILE *)0x0) {
                    s->img_buffer = s->img_buffer + iVar3;
                  }
                  else {
                    fseek((FILE *)s->img_file,(long)iVar3,1);
                  }
                  uVar8 = 0;
                  puVar10 = local_48;
                  do {
                    if (uVar8 < uVar9) {
                      if (0 < iVar2) {
                        puVar11 = local_48 + uVar8;
                        iVar3 = 0;
                        do {
                          uVar5 = get8(s);
                          if (uVar5 != 0x80) {
                            if ((int)uVar5 < 0x80) {
                              iVar12 = uVar5 + 1;
                              iVar3 = iVar12 + iVar3;
                              for (; iVar12 != 0; iVar12 = iVar12 + -1) {
                                iVar6 = get8(s);
                                *puVar11 = (uchar)iVar6;
                                puVar11 = puVar11 + 4;
                              }
                            }
                            else {
                              iVar13 = (uVar5 ^ 0xff) + 2;
                              iVar6 = get8(s);
                              iVar12 = iVar13;
                              do {
                                *puVar11 = (uchar)iVar6;
                                puVar11 = puVar11 + 4;
                                iVar12 = iVar12 + -1;
                              } while (iVar12 != 0);
                              iVar3 = iVar13 + iVar3;
                            }
                          }
                        } while (iVar3 < iVar2);
                      }
                    }
                    else if (0 < iVar2) {
                      lVar7 = 0;
                      do {
                        puVar10[lVar7 * 4] = -(uVar8 == 3);
                        lVar7 = lVar7 + 1;
                      } while (iVar2 != (int)lVar7);
                    }
                    uVar8 = uVar8 + 1;
                    puVar10 = puVar10 + 1;
                  } while (uVar8 != 4);
                }
                if (((req_comp & 0xfffffffbU) == 0) ||
                   (local_48 = convert_format(local_48,4,req_comp,x_00,uVar1),
                   local_48 != (uchar *)0x0)) {
                  if (comp != (int *)0x0) {
                    *comp = uVar9;
                  }
                  *y = uVar1;
                  *x = x_00;
                  return local_48;
                }
              }
            }
            else {
              failure_reason = "PSD has an unknown compression format";
            }
          }
          else {
            failure_reason = "PSD is not in RGB color format";
          }
        }
        else {
          failure_reason = "PSD bit depth is not 8 bit";
        }
      }
      else {
        failure_reason = "Unsupported number of channels in PSD image";
      }
    }
    else {
      failure_reason = "Unsupported version of PSD image";
    }
  }
  else {
    failure_reason = "Corrupt PSD image";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *psd_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	int	pixelCount;
	int channelCount, compression;
	int channel, i, count, len;
   int w,h;
   uint8 *out;

	// Check identifier
	if (get32(s) != 0x38425053)	// "8BPS"
		return epuc("not PSD", "Corrupt PSD image");

	// Check file type version.
	if (get16(s) != 1)
		return epuc("wrong version", "Unsupported version of PSD image");

	// Skip 6 reserved bytes.
	skip(s, 6 );

	// Read the number of channels (R, G, B, A, etc).
	channelCount = get16(s);
	if (channelCount < 0 || channelCount > 16)
		return epuc("wrong channel count", "Unsupported number of channels in PSD image");

	// Read the rows and columns of the image.
   h = get32(s);
   w = get32(s);

	// Make sure the depth is 8 bits.
	if (get16(s) != 8)
		return epuc("unsupported bit depth", "PSD bit depth is not 8 bit");

	// Make sure the color mode is RGB.
	// Valid options are:
	//   0: Bitmap
	//   1: Grayscale
	//   2: Indexed color
	//   3: RGB color
	//   4: CMYK color
	//   7: Multichannel
	//   8: Duotone
	//   9: Lab color
	if (get16(s) != 3)
		return epuc("wrong color format", "PSD is not in RGB color format");

	// Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
	skip(s,get32(s) );

	// Skip the image resources.  (resolution, pen tool paths, etc)
	skip(s, get32(s) );

	// Skip the reserved data.
	skip(s, get32(s) );

	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	compression = get16(s);
	if (compression > 1)
		return epuc("bad compression", "PSD has an unknown compression format");

	// Create the destination image.
	out = (stbi_uc *) malloc(4 * w*h);
	if (!out) return epuc("outofmem", "Out of memory");
   pixelCount = w*h;

	// Initialize the data to zero.
	//memset( out, 0, pixelCount * 4 );

	// Finally, the image data.
	if (compression) {
		// RLE as used by .PSD and .TIFF
		// Loop until you get the number of unpacked bytes you are expecting:
		//     Read the next source byte into n.
		//     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
		//     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
		//     Else if n is 128, noop.
		// Endloop

		// The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
		// which we're going to just skip.
		skip(s, h * channelCount * 2 );

		// Read the RLE data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out+channel;
			if (channel >= channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = (channel == 3 ? 255 : 0), p += 4;
			} else {
				// Read the RLE data.
				count = 0;
				while (count < pixelCount) {
					len = get8(s);
					if (len == 128) {
						// No-op.
					} else if (len < 128) {
						// Copy next len+1 bytes literally.
						len++;
						count += len;
						while (len) {
							*p = get8(s);
                     p += 4;
							len--;
						}
					} else if (len > 128) {
						uint32	val;
						// Next -len+1 bytes in the dest are replicated from next source byte.
						// (Interpret len as a negative 8-bit int.)
						len ^= 0x0FF;
						len += 2;
                  val = get8(s);
						count += len;
						while (len) {
							*p = val;
                     p += 4;
							len--;
						}
					}
				}
			}
		}

	} else {
		// We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.

		// Read the data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out + channel;
			if (channel > channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = channel == 3 ? 255 : 0, p += 4;
			} else {
				// Read the data.
				count = 0;
				for (i = 0; i < pixelCount; i++)
					*p = get8(s), p += 4;
			}
		}
	}

	if (req_comp && req_comp != 4) {
		out = convert_format(out, 4, req_comp, w, h);
		if (out == NULL) return out; // convert_format frees input on failure
	}

	if (comp) *comp = channelCount;
	*y = h;
	*x = w;

	return out;
}